

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_4::PtexSeparableFilter::apply
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f)

{
  byte bVar1;
  DataType DVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char cVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar11;
  long *plVar12;
  float *pfVar13;
  int iVar14;
  int iVar15;
  float *pfVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  float *pfVar22;
  float fVar23;
  float fVar24;
  undefined8 uStack_f0;
  float local_e8;
  undefined1 auStack_e4 [4];
  PtexSeparableKernel kt;
  long *plVar10;
  
  pfVar16 = &local_e8;
  if (k->uw < 1) {
    return;
  }
  if (k->vw < 1) {
    return;
  }
  bVar1 = (k->res).ulog2;
  while (1 << ((f->res).ulog2 & 0x1fU) < 1 << (bVar1 & 0x1f)) {
    uStack_f0 = 0x10eeb9;
    PtexSeparableKernel::downresU(k);
    bVar1 = (k->res).ulog2;
  }
  if (1 << ((f->res).vlog2 & 0x1fU) < 1 << ((k->res).vlog2 & 0x1fU)) {
    do {
      uStack_f0 = 0x10eee5;
      PtexSeparableKernel::downresV(k);
    } while (1 << ((f->res).vlog2 & 0x1fU) < 1 << ((k->res).vlog2 & 0x1fU));
  }
  uStack_f0 = 0x10ef16;
  iVar9 = (*this->_tx->_vptr_PtexTexture[0x14])(this->_tx,(ulong)(uint)faceid,(ulong)*(uint *)k);
  plVar10 = (long *)CONCAT44(extraout_var,iVar9);
  if (plVar10 == (long *)0x0) {
    return;
  }
  uStack_f0 = 0x10ef2c;
  cVar8 = (**(code **)(*plVar10 + 0x18))();
  if (cVar8 != '\0') {
    pfVar22 = this->_result;
    uStack_f0 = 0x10ef46;
    lVar11 = (**(code **)(*plVar10 + 0x30))();
    iVar9 = this->_firstChanOffset;
    DVar2 = this->_dt;
    uVar3 = this->_nchan;
    uStack_f0 = 0x10ef61;
    PtexSeparableKernel::weight(k);
    iVar17 = 0;
    if (uVar3 < 5) {
      iVar17 = uVar3 * 4;
    }
    uStack_f0 = 0x10ef8f;
    (**(code **)(PtexUtils::applyConstFunctions + ((long)iVar17 + (long)(int)DVar2) * 8))
              (pfVar22,lVar11 + iVar9,uVar3);
    goto LAB_0010f3c2;
  }
  iVar9 = this->_nchan;
  if (iVar9 < 2 || this->_efm != efm_tanvec) {
    bVar6 = false;
  }
  else {
    bVar6 = 0 < k->rot;
  }
  if (bVar6) {
    lVar11 = -((long)iVar9 * 4 + 0xfU & 0xfffffffffffffff0);
    pfVar22 = (float *)((long)&local_e8 + lVar11);
    *(undefined8 *)((long)&uStack_f0 + lVar11) = 0x10effb;
    memset(pfVar22,0,(long)iVar9 << 2);
    pfVar16 = pfVar22;
  }
  else {
    pfVar22 = this->_result;
    pfVar16 = &local_e8;
  }
  pcVar4 = *(code **)(*plVar10 + 0x38);
  pfVar16[-2] = 1.55547e-39;
  pfVar16[-1] = 0.0;
  cVar8 = (*pcVar4)(plVar10);
  if (cVar8 == '\0') {
    pcVar4 = *(code **)(*plVar10 + 0x30);
    pfVar16[-2] = 1.556387e-39;
    pfVar16[-1] = 0.0;
    lVar11 = (*pcVar4)();
    iVar9 = this->_firstChanOffset;
    uVar3 = this->_nchan;
    iVar17 = 0;
    if (uVar3 < 5) {
      iVar17 = uVar3 * 4;
    }
    iVar21 = iVar17 + 0x14;
    if (uVar3 == this->_ntxchan) {
      iVar21 = iVar17;
    }
    pcVar4 = *(code **)(PtexSeparableKernel::applyFunctions + (long)(int)(iVar21 + this->_dt) * 8);
    pfVar16[-2] = 1.556491e-39;
    pfVar16[-1] = 0.0;
    (*pcVar4)(k,pfVar22,lVar11 + iVar9);
  }
  else {
    pcVar4 = *(code **)(*plVar10 + 0x40);
    pfVar16[-2] = 1.555504e-39;
    pfVar16[-1] = 0.0;
    local_e8._0_2_ = (*pcVar4)(plVar10);
    _auStack_e4 = 0;
    kt.u = 0;
    kt.v = 0;
    kt._16_8_ = &kt.kv;
    kt.ku = kt.kubuff + 8;
    kt.kvbuff[8] = 0.0;
    kt.kv._0_4_ = 0;
    kt.kubuff[8] = 0.0;
    iVar21 = 1 << ((byte)local_e8._0_2_ & 0x1f);
    iVar17 = 1 << ((byte)((ushort)local_e8._0_2_ >> 8) & 0x1f);
    iVar9 = k->vw;
    if (0 < iVar9) {
      iVar20 = k->v;
      do {
        iVar14 = iVar20 % iVar17;
        _auStack_e4 = CONCAT44(iVar14,auStack_e4);
        iVar14 = iVar17 - iVar14;
        kt._124_4_ = iVar9;
        if (iVar9 < iVar14) {
          iVar14 = iVar9;
        }
        kt.v = iVar14;
        kt.ku = k->kv + ((long)iVar20 - (long)k->v);
        if (0 < k->uw) {
          iVar9 = k->u;
          iVar14 = k->uw;
          do {
            iVar15 = iVar9 % iVar21;
            _auStack_e4 = CONCAT44(kt._0_4_,iVar15);
            iVar15 = iVar21 - iVar15;
            if (iVar14 < iVar15) {
              iVar15 = iVar14;
            }
            kt.u = iVar15;
            kt._16_8_ = k->ku + ((long)iVar9 - (long)k->u);
            pcVar4 = *(code **)(*plVar10 + 0x48);
            pfVar16[-2] = 1.555893e-39;
            pfVar16[-1] = 0.0;
            plVar12 = (long *)(*pcVar4)(plVar10);
            if (plVar12 != (long *)0x0) {
              pcVar4 = *(code **)(*plVar12 + 0x18);
              pfVar16[-2] = 1.555922e-39;
              pfVar16[-1] = 0.0;
              cVar8 = (*pcVar4)(plVar12);
              pcVar4 = *(code **)(*plVar12 + 0x30);
              if (cVar8 == '\0') {
                pfVar16[-2] = 1.556171e-39;
                pfVar16[-1] = 0.0;
                lVar11 = (*pcVar4)(plVar12);
                iVar15 = this->_firstChanOffset;
                uVar3 = this->_nchan;
                iVar18 = uVar3 * 4;
                if (4 < uVar3) {
                  iVar18 = 0;
                }
                iVar7 = iVar18 + 0x14;
                if (uVar3 == this->_ntxchan) {
                  iVar7 = iVar18;
                }
                pcVar4 = *(code **)(PtexSeparableKernel::applyFunctions +
                                   (long)(int)(iVar7 + this->_dt) * 8);
                pfVar16[-2] = 1.556283e-39;
                pfVar16[-1] = 0.0;
                (*pcVar4)(&local_e8,pfVar22,lVar11 + iVar15);
              }
              else {
                pfVar16[-2] = 1.55595e-39;
                pfVar16[-1] = 0.0;
                lVar11 = (*pcVar4)(plVar12);
                fVar24 = 0.0;
                fVar23 = 0.0;
                if ((long)kt.u != 0) {
                  lVar19 = 0;
                  do {
                    fVar23 = fVar23 + *(float *)(kt._16_8_ + lVar19);
                    lVar19 = lVar19 + 4;
                  } while ((long)kt.u * 4 != lVar19);
                }
                if ((long)kt.v != 0) {
                  fVar24 = 0.0;
                  lVar19 = 0;
                  do {
                    fVar24 = fVar24 + *(float *)((long)kt.ku + lVar19);
                    lVar19 = lVar19 + 4;
                  } while ((long)kt.v * 4 != lVar19);
                }
                iVar15 = this->_firstChanOffset;
                iVar18 = this->_nchan * 4;
                if (4 < (uint)this->_nchan) {
                  iVar18 = 0;
                }
                pcVar4 = *(code **)(PtexUtils::applyConstFunctions +
                                   ((long)iVar18 + (long)(int)this->_dt) * 8);
                pfVar16[-2] = 1.556162e-39;
                pfVar16[-1] = 0.0;
                (*pcVar4)(fVar23 * fVar24,pfVar22,lVar11 + iVar15);
              }
              if (plVar12 != (long *)0x0) {
                pcVar4 = *(code **)(*plVar12 + 0x10);
                pfVar16[-2] = 1.556303e-39;
                pfVar16[-1] = 0.0;
                (*pcVar4)(plVar12);
              }
            }
            iVar9 = iVar9 + kt.u;
            iVar15 = iVar14 - kt.u;
            bVar5 = kt.u <= iVar14;
            iVar14 = iVar15;
          } while (iVar15 != 0 && bVar5);
        }
        iVar20 = iVar20 + kt.v;
        iVar9 = kt._124_4_ - kt.v;
      } while (iVar9 != 0 && kt.v <= (int)kt._124_4_);
    }
  }
  if (!bVar6) goto LAB_0010f3c2;
  switch(k->rot) {
  case 0:
    pfVar13 = this->_result;
    *pfVar13 = *pfVar22 + *pfVar13;
    fVar23 = pfVar22[1];
    goto LAB_0010f385;
  case 1:
    pfVar13 = this->_result;
    *pfVar13 = *pfVar13 - pfVar22[1];
    fVar23 = *pfVar22;
LAB_0010f385:
    fVar23 = fVar23 + pfVar13[1];
LAB_0010f38a:
    pfVar13[1] = fVar23;
    break;
  case 2:
    pfVar13 = this->_result;
    *pfVar13 = *pfVar13 - *pfVar22;
    pfVar13[1] = pfVar13[1] - pfVar22[1];
    break;
  case 3:
    pfVar13 = this->_result;
    *pfVar13 = pfVar22[1] + *pfVar13;
    fVar23 = pfVar13[1] - *pfVar22;
    goto LAB_0010f38a;
  }
  iVar9 = this->_nchan;
  if (2 < (long)iVar9) {
    pfVar13 = this->_result;
    lVar11 = 2;
    do {
      pfVar13[lVar11] = pfVar22[lVar11] + pfVar13[lVar11];
      lVar11 = lVar11 + 1;
    } while (iVar9 != lVar11);
  }
LAB_0010f3c2:
  if (plVar10 != (long *)0x0) {
    pcVar4 = *(code **)(*plVar10 + 0x10);
    pfVar16[-2] = 1.556833e-39;
    pfVar16[-1] = 0.0;
    (*pcVar4)();
  }
  return;
}

Assistant:

void PtexSeparableFilter::apply(PtexSeparableKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    assert(k.u >= 0 && k.u + k.uw <= k.res.u());
    assert(k.v >= 0 && k.v + k.vw <= k.res.v());

    if (k.uw <= 0 || k.vw <= 0) return;

    // downres kernel if needed
    while (k.res.u() > f.res.u()) k.downresU();
    while (k.res.v() > f.res.v()) k.downresV();

    // get face data, and apply
    PtexPtr<PtexFaceData> dh ( _tx->getData(faceid, k.res) );
    if (!dh) return;

    if (dh->isConstant()) {
        k.applyConst(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan);
        return;
    }

    // allocate temporary result for tanvec mode (if needed)
    bool tanvecMode = (_efm == efm_tanvec) && (_nchan >= 2) && (k.rot > 0);
    float* result = tanvecMode ? (float*) alloca(sizeof(float)*_nchan) : _result;
    if (tanvecMode) memset(result, 0, sizeof(float)*_nchan);

    if (dh->isTiled()) {
        Ptex::Res tileres = dh->tileRes();
        PtexSeparableKernel kt;
        kt.res = tileres;
        int tileresu = tileres.u();
        int tileresv = tileres.v();
        int ntilesu = k.res.u() / tileresu;
        for (int v = k.v, vw = k.vw; vw > 0; vw -= kt.vw, v += kt.vw) {
            int tilev = v / tileresv;
            kt.v = v % tileresv;
            kt.vw = PtexUtils::min(vw, tileresv - kt.v);
            kt.kv = k.kv + v - k.v;
            for (int u = k.u, uw = k.uw; uw > 0; uw -= kt.uw, u += kt.uw) {
                int tileu = u / tileresu;
                kt.u = u % tileresu;
                kt.uw = PtexUtils::min(uw, tileresu - kt.u);
                kt.ku = k.ku + u - k.u;
                PtexPtr<PtexFaceData> th ( dh->getTile(tilev * ntilesu + tileu) );
                if (th) {
                    if (th->isConstant())
                        kt.applyConst(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan);
                    else
                        kt.apply(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
                }
            }
        }
    }
    else {
        k.apply(result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
    }

    if (tanvecMode) {
        // rotate tangent-space vector data and update main result
        switch (k.rot) {
            case 0: // rot==0 included for completeness, but tanvecMode should be false in this case
                _result[0] += result[0];
                _result[1] += result[1];
                break;
            case 1:
                _result[0] -= result[1];
                _result[1] += result[0];
                break;
            case 2:
                _result[0] -= result[0];
                _result[1] -= result[1];
                break;
            case 3:
                _result[0] += result[1];
                _result[1] -= result[0];
                break;
        }
        for (int i = 2; i < _nchan; i++) _result[i] += result[i];
    }
}